

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void char_mods_callback(GLFWwindow *window,uint codepoint,int mods)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  double dVar6;
  Slot *slot;
  int mods_local;
  uint codepoint_local;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar6 = glfwGetTime();
  pcVar4 = get_character_string(codepoint);
  pcVar5 = get_mods_name(mods);
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) with modifiers (with%s) input\n",dVar6,
         (ulong)uVar2,(ulong)uVar1,(ulong)codepoint,pcVar4,pcVar5);
  return;
}

Assistant:

static void char_mods_callback(GLFWwindow* window, unsigned int codepoint, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) with modifiers (with%s) input\n",
            counter++, slot->number, glfwGetTime(), codepoint,
            get_character_string(codepoint),
            get_mods_name(mods));
}